

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O3

bool dxil_spv::emit_msad_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  Builder *this;
  undefined8 *ptr;
  undefined8 *ptr_00;
  Operation *pOVar5;
  Value *pVVar6;
  Operation *pOVar7;
  Operation *pOVar8;
  Operation *this_00;
  uint32_t i;
  long lVar9;
  uint32_t i_1;
  uint value;
  uint32_t lit;
  
  this = Converter::Impl::builder(impl);
  if (impl->glsl_std450_ext == 0) {
    IVar1 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar1;
  }
  value = 0;
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar2 = spv::Builder::makeVectorType(this,IVar1,4);
  IVar3 = spv::Builder::makeBoolType(this);
  IVar3 = spv::Builder::makeVectorType(this,IVar3,4);
  ptr = (undefined8 *)allocate_in_thread(0x10);
  *ptr = 0;
  ptr[1] = 0;
  ptr_00 = (undefined8 *)allocate_in_thread(0x10);
  *ptr_00 = 0;
  ptr_00[1] = 0;
  lVar9 = 0;
  do {
    pOVar5 = Converter::Impl::allocate(impl,OpBitFieldUExtract,IVar1);
    pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    Operation::add_id(pOVar5,IVar4);
    IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(this,IVar4,value,false);
    Operation::add_id(pOVar5,IVar4);
    IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(this,IVar4,8,false);
    Operation::add_id(pOVar5,IVar4);
    Converter::Impl::add(impl,pOVar5,false);
    pOVar7 = Converter::Impl::allocate(impl,OpBitFieldUExtract,IVar1);
    pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    Operation::add_id(pOVar7,IVar4);
    IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(this,IVar4,value,false);
    Operation::add_id(pOVar7,IVar4);
    IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(this,IVar4,8,false);
    Operation::add_id(pOVar7,IVar4);
    Converter::Impl::add(impl,pOVar7,false);
    *(Id *)((long)ptr + lVar9 * 4) = pOVar5->id;
    *(Id *)((long)ptr_00 + lVar9 * 4) = pOVar7->id;
    lVar9 = lVar9 + 1;
    value = value + 8;
  } while (lVar9 != 4);
  pOVar5 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar2);
  lVar9 = 0;
  do {
    Operation::add_id(pOVar5,*(Id *)((long)ptr + lVar9 * 4));
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  lVar9 = 0;
  Converter::Impl::add(impl,pOVar5,false);
  pOVar7 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar2);
  do {
    Operation::add_id(pOVar7,*(Id *)((long)ptr_00 + lVar9 * 4));
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  lit = 0;
  Converter::Impl::add(impl,pOVar7,false);
  IVar4 = spv::Builder::makeNullConstant(this,IVar2);
  pOVar8 = Converter::Impl::allocate(impl,OpIEqual,IVar3);
  Operation::add_id(pOVar8,pOVar5->id);
  Operation::add_id(pOVar8,IVar4);
  Converter::Impl::add(impl,pOVar8,false);
  this_00 = Converter::Impl::allocate(impl,OpISub,IVar2);
  Operation::add_id(this_00,pOVar5->id);
  Operation::add_id(this_00,pOVar7->id);
  Converter::Impl::add(impl,this_00,false);
  pOVar5 = Converter::Impl::allocate(impl,OpExtInst,IVar2);
  Operation::add_id(pOVar5,impl->glsl_std450_ext);
  Operation::add_literal(pOVar5,5);
  Operation::add_id(pOVar5,this_00->id);
  Converter::Impl::add(impl,pOVar5,false);
  pOVar7 = Converter::Impl::allocate(impl,OpSelect,IVar2);
  Operation::add_id(pOVar7,pOVar8->id);
  Operation::add_id(pOVar7,IVar4);
  Operation::add_id(pOVar7,pOVar5->id);
  Converter::Impl::add(impl,pOVar7,false);
  IVar2 = 0;
  do {
    pOVar8 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar1);
    Operation::add_id(pOVar8,pOVar7->id);
    Operation::add_literal(pOVar8,lit);
    Converter::Impl::add(impl,pOVar8,false);
    pOVar5 = pOVar8;
    if (IVar2 != 0) {
      pOVar5 = Converter::Impl::allocate(impl,OpIAdd,IVar1);
      Operation::add_id(pOVar5,IVar2);
      Operation::add_id(pOVar5,pOVar8->id);
      Converter::Impl::add(impl,pOVar5,false);
    }
    IVar2 = pOVar5->id;
    lit = lit + 1;
  } while (lit != 4);
  pOVar5 = Converter::Impl::allocate(impl,OpIAdd,(Value *)instruction);
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
  Operation::add_id(pOVar5,IVar1);
  Operation::add_id(pOVar5,IVar2);
  Converter::Impl::add(impl,pOVar5,false);
  free_in_thread(ptr_00);
  free_in_thread(ptr);
  return true;
}

Assistant:

bool emit_msad_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	// Don't modify this implementation since compilers pattern match this.

	spv::Id uint32_scalar_type = builder.makeUintType(32);
	spv::Id uint32_vector_type = builder.makeVectorType(uint32_scalar_type, 4);
	spv::Id bool_type = builder.makeVectorType(builder.makeBoolType(), 4);

	Vector<spv::Id> ref_byte_ids = { 0, 0, 0, 0 };
	Vector<spv::Id> src_byte_ids = { 0, 0, 0, 0 };

	for (uint32_t i = 0; i < 4; i++)
	{
		auto *ref_bfe_op = impl.allocate(spv::OpBitFieldUExtract, uint32_scalar_type);
		ref_bfe_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		ref_bfe_op->add_id(builder.makeUintConstant(8 * i));
		ref_bfe_op->add_id(builder.makeUintConstant(8));
		impl.add(ref_bfe_op);

		auto *src_bfe_op = impl.allocate(spv::OpBitFieldUExtract, uint32_scalar_type);
		src_bfe_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		src_bfe_op->add_id(builder.makeUintConstant(8 * i));
		src_bfe_op->add_id(builder.makeUintConstant(8));
		impl.add(src_bfe_op);

		ref_byte_ids[i] = ref_bfe_op->id;
		src_byte_ids[i] = src_bfe_op->id;
	}

	auto *ref_composite_op = impl.allocate(spv::OpCompositeConstruct, uint32_vector_type);
	for (uint32_t i = 0; i < 4; i++)
		ref_composite_op->add_id(ref_byte_ids[i]);
	impl.add(ref_composite_op);

	auto *src_composite_op = impl.allocate(spv::OpCompositeConstruct, uint32_vector_type);
	for (uint32_t i = 0; i < 4; i++)
		src_composite_op->add_id(src_byte_ids[i]);
	impl.add(src_composite_op);

	spv::Id zero_vector = builder.makeNullConstant(uint32_vector_type);

	auto *compare_ref_zero_op = impl.allocate(spv::OpIEqual, bool_type);
	compare_ref_zero_op->add_id(ref_composite_op->id);
	compare_ref_zero_op->add_id(zero_vector);
	impl.add(compare_ref_zero_op);

	auto *ref_src_diff_op = impl.allocate(spv::OpISub, uint32_vector_type);
	ref_src_diff_op->add_id(ref_composite_op->id);
	ref_src_diff_op->add_id(src_composite_op->id);
	impl.add(ref_src_diff_op);

	auto *abs_diff_op = impl.allocate(spv::OpExtInst, uint32_vector_type);
	abs_diff_op->add_id(impl.glsl_std450_ext);
	abs_diff_op->add_literal(GLSLstd450SAbs);
	abs_diff_op->add_id(ref_src_diff_op->id);
	impl.add(abs_diff_op);

	auto *masked_diff_op = impl.allocate(spv::OpSelect, uint32_vector_type);
	masked_diff_op->add_id(compare_ref_zero_op->id);
	masked_diff_op->add_id(zero_vector);
	masked_diff_op->add_id(abs_diff_op->id);
	impl.add(masked_diff_op);

	spv::Id sum_id = 0;

	for (uint32_t i = 0; i < 4; i++)
	{
		auto *extract_op = impl.allocate(spv::OpCompositeExtract, uint32_scalar_type);
		extract_op->add_id(masked_diff_op->id);
		extract_op->add_literal(i);
		impl.add(extract_op);

		if (sum_id)
		{
			auto *add_op = impl.allocate(spv::OpIAdd, uint32_scalar_type);
			add_op->add_id(sum_id);
			add_op->add_id(extract_op->id);
			impl.add(add_op);

			sum_id = add_op->id;
		}
		else
			sum_id = extract_op->id;
	}

	/* DXIL docs say that the addition should saturate on overflow,
	 * but but drivers don't seem to do that. */
	auto *add_op = impl.allocate(spv::OpIAdd, instruction);
	add_op->add_id(impl.get_id_for_value(instruction->getOperand(3)));
	add_op->add_id(sum_id);
	impl.add(add_op);

	return true;
}